

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec10.c
# Opt level: O2

void If_Dec10MoveTo(word *pF,int nVars,int v,int p,int *Pla2Var,int *Var2Pla)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  word *pwVar4;
  word *pwVar5;
  uint uVar6;
  ulong uVar7;
  word *pwVar8;
  word *pwVar9;
  ulong uVar10;
  uint uVar11;
  word *pwVar12;
  word *pwVar13;
  bool bVar14;
  uint uVar15;
  uint uVar16;
  word *pwVar17;
  int iVar18;
  word *pwVar19;
  word *pwVar20;
  word *pIn;
  ulong uVar21;
  word pG [16];
  
  iVar2 = Var2Pla[v];
  if (p < iVar2) {
    __assert_fail("Var2Pla[v] <= p",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                  ,0xf1,"void If_Dec10MoveTo(word *, int, int, int, int *, int *)");
  }
  uVar15 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar15 = 1;
  }
  bVar14 = false;
  uVar21 = 0;
  if (0 < (int)uVar15) {
    uVar21 = (ulong)uVar15;
  }
  pwVar5 = pG;
  pIn = pF;
  while (pwVar4 = pwVar5, iVar2 != p) {
    if (nVars + -1 <= iVar2) {
      __assert_fail("iVar < nVars - 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                    ,0xcc,"void If_Dec10SwapAdjacent(word *, word *, int, int)");
    }
    if (iVar2 < 5) {
      for (uVar7 = 0; uVar21 != uVar7; uVar7 = uVar7 + 1) {
        uVar10 = pIn[uVar7];
        bVar1 = (byte)(1 << ((byte)iVar2 & 0x1f));
        pwVar4[uVar7] =
             (uVar10 & PMasks[iVar2][2]) >> (bVar1 & 0x3f) |
             (PMasks[iVar2][1] & uVar10) << (bVar1 & 0x3f) | PMasks[iVar2][0] & uVar10;
      }
    }
    else if (iVar2 == 5) {
      for (lVar3 = 0; lVar3 < (int)uVar15; lVar3 = lVar3 + 2) {
        uVar7 = pIn[lVar3];
        uVar10 = pIn[lVar3 + 1];
        pwVar4[lVar3] = uVar10 << 0x20 | uVar7 & 0xffffffff;
        pwVar4[lVar3 + 1] = uVar7 >> 0x20 | uVar10 & 0xffffffff00000000;
      }
    }
    else {
      bVar1 = (byte)iVar2 - 6;
      uVar7 = (ulong)(uint)(1 << (bVar1 & 0x1f));
      uVar11 = 2 << (bVar1 & 0x1f);
      uVar16 = 3 << (bVar1 & 0x1f);
      uVar6 = 4 << (bVar1 & 0x1f);
      pwVar5 = pwVar4 + uVar7;
      pwVar8 = pIn + uVar11;
      pwVar20 = pwVar4 + uVar11;
      pwVar9 = pIn + uVar7;
      pwVar13 = pwVar4 + uVar16;
      pwVar17 = pIn + uVar16;
      pwVar12 = pwVar4;
      pwVar19 = pIn;
      for (iVar18 = 0; iVar18 < (int)uVar15; iVar18 = iVar18 + uVar6) {
        for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
          pwVar12[uVar10] = pwVar19[uVar10];
        }
        for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
          pwVar5[uVar10] = pwVar8[uVar10];
        }
        for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
          pwVar20[uVar10] = pwVar9[uVar10];
        }
        for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
          pwVar13[uVar10] = pwVar17[uVar10];
        }
        pwVar12 = pwVar12 + uVar6;
        pwVar19 = pwVar19 + uVar6;
        pwVar5 = pwVar5 + uVar6;
        pwVar8 = pwVar8 + uVar6;
        pwVar20 = pwVar20 + uVar6;
        pwVar9 = pwVar9 + uVar6;
        pwVar13 = pwVar13 + uVar6;
        pwVar17 = pwVar17 + uVar6;
      }
    }
    Var2Pla[Pla2Var[iVar2]] = Var2Pla[Pla2Var[iVar2]] + 1;
    Var2Pla[Pla2Var[(long)iVar2 + 1]] = Var2Pla[Pla2Var[(long)iVar2 + 1]] + -1;
    *(ulong *)(Pla2Var + iVar2) =
         CONCAT44((int)*(undefined8 *)(Pla2Var + iVar2),
                  (int)((ulong)*(undefined8 *)(Pla2Var + iVar2) >> 0x20));
    bVar14 = (bool)(bVar14 ^ 1);
    pwVar5 = pIn;
    pIn = pwVar4;
    iVar2 = Var2Pla[v];
  }
  if (bVar14) {
    If_Dec10Copy(pF,pIn,nVars);
  }
  if (Pla2Var[(uint)p] == v) {
    return;
  }
  __assert_fail("Pla2Var[p] == v",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                ,0x101,"void If_Dec10MoveTo(word *, int, int, int, int *, int *)");
}

Assistant:

static inline void If_Dec10MoveTo( word * pF, int nVars, int v, int p, int Pla2Var[], int Var2Pla[] )
{
    word pG[16], * pIn = pF, * pOut = pG, * pTemp;
    int iPlace0, iPlace1, Count = 0;
    assert( Var2Pla[v] <= p );
    while ( Var2Pla[v] != p )
    {
        iPlace0 = Var2Pla[v];
        iPlace1 = Var2Pla[v]+1;
        If_Dec10SwapAdjacent( pOut, pIn, iPlace0, nVars );
        pTemp = pIn; pIn = pOut, pOut = pTemp;
        Var2Pla[Pla2Var[iPlace0]]++;
        Var2Pla[Pla2Var[iPlace1]]--;
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Pla2Var[iPlace1] ^= Pla2Var[iPlace0];
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Count++;
    }
    if ( Count & 1 )
        If_Dec10Copy( pF, pIn, nVars );
    assert( Pla2Var[p] == v );
}